

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::
     IntegerBinaryCastLoop<duckdb::DecimalCastData<short>,false,false,duckdb::DecimalCastOperation>
               (char *buf,idx_t len,DecimalCastData<short> *result,bool strict)

{
  bool bVar1;
  ulong uVar2;
  DecimalCastData<short> *in_RDX;
  ulong in_RSI;
  long in_RDI;
  char current_char;
  uint8_t digit;
  idx_t pos;
  idx_t start_pos;
  DecimalCastData<short> *in_stack_ffffffffffffffb8;
  uint8_t local_39;
  ulong local_38;
  
  local_38 = 1;
  while( true ) {
    if (in_RSI <= local_38) {
      bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>
                        (in_stack_ffffffffffffffb8);
      if (!bVar1) {
        return false;
      }
      return 1 < local_38;
    }
    if (*(char *)(in_RDI + local_38) == '0') {
      local_39 = '\0';
    }
    else {
      if (*(char *)(in_RDI + local_38) != '1') {
        return false;
      }
      local_39 = '\x01';
    }
    uVar2 = local_38 + 1;
    if (((uVar2 != in_RSI) && (*(char *)(in_RDI + uVar2) == '_')) &&
       ((uVar2 = local_38 + 2, uVar2 == in_RSI ||
        ((*(char *)(in_RDI + uVar2) != '0' && (*(char *)(in_RDI + uVar2) != '1')))))) break;
    local_38 = uVar2;
    bVar1 = DecimalCastOperation::HandleBinaryDigit<duckdb::DecimalCastData<short>,false>
                      (in_RDX,local_39);
    if (!bVar1) {
      return false;
    }
  }
  return false;
}

Assistant:

static bool IntegerBinaryCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	if (ALLOW_EXPONENT || NEGATIVE) {
		return false;
	}
	idx_t start_pos = 1;
	idx_t pos = start_pos;
	uint8_t digit;
	char current_char;
	while (pos < len) {
		current_char = buf[pos];
		if (current_char == '0') {
			digit = 0;
		} else if (current_char == '1') {
			digit = 1;
		} else {
			return false;
		}
		pos++;
		if (pos != len && buf[pos] == '_') {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || (buf[pos] != '0' && buf[pos] != '1')) {
				return false;
			}
		}

		if (!OP::template HandleBinaryDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}